

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-test.c++
# Opt level: O1

void __thiscall kj::anon_unknown_0::TestCase98::run(TestCase98 *this)

{
  PromiseNode *pPVar1;
  PromiseNode *pPVar2;
  Disposer *pDVar3;
  __pid_t _Var4;
  TransformPromiseNodeBase *pTVar5;
  Promise<int> promise;
  int line;
  WaitScope waitScope;
  EventLoop loop;
  Own<kj::_::PromiseNode> local_88;
  Own<kj::_::PromiseNode> local_78;
  int local_64;
  EventLoop *local_60;
  undefined4 local_58;
  __pid_t local_4c;
  EventLoop local_48;
  
  EventLoop::EventLoop(&local_48);
  local_58 = 0xffffffff;
  local_60 = &local_48;
  EventLoop::enterScope(&local_48);
  _::yield();
  pTVar5 = (TransformPromiseNodeBase *)operator_new(0x28);
  _::TransformPromiseNodeBase::TransformPromiseNodeBase
            (pTVar5,&local_78,
             _::
             TransformPromiseNode<int,_kj::_::Void,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-test.c++:103:7),_kj::_::PropagateException>
             ::anon_class_1_0_00000001_for_func::operator());
  pPVar1 = local_78.ptr;
  (pTVar5->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_00450f68;
  local_88.disposer =
       (Disposer *)
       &_::
        HeapDisposer<kj::_::TransformPromiseNode<int,kj::_::Void,kj::(anonymous_namespace)::TestCase98::run()::$_0,kj::_::PropagateException>>
        ::instance;
  local_88.ptr = (PromiseNode *)pTVar5;
  if (local_78.ptr != (PromiseNode *)0x0) {
    local_78.ptr = (PromiseNode *)0x0;
    (*(code *)**(undefined8 **)CONCAT44(local_78.disposer._4_4_,local_78.disposer._0_4_))
              ((undefined8 *)CONCAT44(local_78.disposer._4_4_,local_78.disposer._0_4_),
               pPVar1->_vptr_PromiseNode[-2] + (long)&pPVar1->_vptr_PromiseNode);
  }
  local_78.disposer._0_4_ = 0x67;
  pTVar5 = (TransformPromiseNodeBase *)operator_new(0x30);
  _::TransformPromiseNodeBase::TransformPromiseNodeBase
            (pTVar5,&local_88,
             _::
             TransformPromiseNode<int,_int,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-test.c++:107:7),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-test.c++:108:7)>
             ::anon_class_1_0_00000001_for_func::operator());
  pDVar3 = local_88.disposer;
  (pTVar5->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_00450ff0;
  pTVar5[1].dependency.disposer = (Disposer *)&local_78;
  local_88.disposer =
       (Disposer *)
       &_::
        HeapDisposer<kj::_::TransformPromiseNode<int,int,kj::(anonymous_namespace)::TestCase98::run()::$_1,kj::(anonymous_namespace)::TestCase98::run()::$_2>>
        ::instance;
  if ((TransformPromiseNodeBase *)local_88.ptr != (TransformPromiseNodeBase *)0x0) {
    pPVar1 = (PromiseNode *)&(local_88.ptr)->_vptr_PromiseNode;
    pPVar2 = (PromiseNode *)&(local_88.ptr)->_vptr_PromiseNode;
    local_88.ptr = (PromiseNode *)pTVar5;
    (**pDVar3->_vptr_Disposer)
              (pDVar3,pPVar1->_vptr_PromiseNode[-2] + (long)&pPVar2->_vptr_PromiseNode);
    pTVar5 = (TransformPromiseNodeBase *)local_88.ptr;
  }
  local_88.ptr = &pTVar5->super_PromiseNode;
  _Var4 = Promise<int>::wait((Promise<int> *)&local_88,&local_60);
  if ((_Var4 != 0x159) && (_::Debug::minSeverity < 3)) {
    local_64 = 0x159;
    local_4c = Promise<int>::wait((Promise<int> *)&local_88,&local_60);
    _::Debug::log<char_const(&)[52],int,int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-test.c++"
               ,0x6e,ERROR,
               "\"failed: expected \" \"(345) == (promise.wait(waitScope))\", 345, promise.wait(waitScope)"
               ,(char (*) [52])"failed: expected (345) == (promise.wait(waitScope))",&local_64,
               &local_4c);
  }
  pPVar1 = local_88.ptr;
  if ((TransformPromiseNodeBase *)local_88.ptr != (TransformPromiseNodeBase *)0x0) {
    local_88.ptr = (PromiseNode *)0x0;
    (**(local_88.disposer)->_vptr_Disposer)
              (local_88.disposer,
               ((PromiseNode *)&pPVar1->_vptr_PromiseNode)->_vptr_PromiseNode[-2] +
               (long)&((PromiseNode *)&pPVar1->_vptr_PromiseNode)->_vptr_PromiseNode);
  }
  EventLoop::leaveScope(local_60);
  EventLoop::~EventLoop(&local_48);
  return;
}

Assistant:

TEST(Async, HandleException) {
  EventLoop loop;
  WaitScope waitScope(loop);

  Promise<int> promise = evalLater(
      [&]() -> int { KJ_FAIL_ASSERT("foo") { return 123; } });
  int line = __LINE__ - 1;

  promise = promise.then(
      [](int i) { return i + 1; },
      [&](Exception&& e) { EXPECT_EQ(line, e.getLine()); return 345; });

  EXPECT_EQ(345, promise.wait(waitScope));
}